

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall UdpSocketImpl::SelectThread(UdpSocketImpl *this)

{
  BaseSocket *pBVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  memory_order mVar8;
  __int_type _Var9;
  type pcVar10;
  ssize_t sVar11;
  ostream *poVar12;
  char *pcVar13;
  uchar *__args;
  unsigned_long __args_1;
  type __result;
  int *piVar14;
  atomic_uchar *this_00;
  UdpSocket *local_498;
  int local_44c;
  uchar cExpected;
  type local_440;
  thread local_428;
  lock_guard<std::mutex> local_420;
  lock_guard<std::mutex> lock;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_3f8;
  __array tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  int local_3c8;
  allocator<char> local_3c1;
  int iRet;
  string caAddrBuf;
  stringstream strAbsender;
  ostream local_390 [376];
  UdpSocket *local_218;
  UdpSocket *pUdpSocket;
  duration<long,_std::ratio<1L,_1000L>_> local_208;
  int local_200 [2];
  int32_t transferred;
  socklen_t sinLen;
  anon_union_28_2_13231a05 SenderAddr;
  socklen_t iLen;
  fd_set *__arr_1;
  __fd_mask *p_Stack_1c8;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_1b8 [4];
  uint __i;
  timeval timeout;
  fd_set errorfd;
  fd_set readfd;
  int local_94;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  unique_ptr<char[],_std::default_delete<char[]>_> local_88;
  __array buf;
  undefined1 local_78 [7];
  bool bSocketShutDown;
  mutex mxNotify;
  bool bReadCall;
  UdpSocketImpl *this_local;
  bool local_26;
  
  mxNotify.super___mutex_base._M_mutex.__size[0x27] = '\0';
  std::mutex::mutex((mutex *)local_78);
  buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._7_1_ = 0;
  std::make_unique<char[]>((size_t)&local_88);
  do {
    while( true ) {
      do {
        do {
          while( true ) {
            if (((this->super_BaseSocketImpl).m_bStop & 1U) != 0) goto LAB_0013707f;
            _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base *)&this->m_atInBytes);
            if (_Var9 < 0x40001) break;
            local_94 = 1;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                      ((duration<long,std::ratio<1l,1000l>> *)&local_90,&local_94);
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_90);
          }
          memset(errorfd.fds_bits + 0xf,0,0x80);
          memset(&timeout.tv_usec,0,0x80);
          memset(auStack_1b8,0,0x10);
          _auStack_1b8 = 2;
          timeout.tv_sec = 0;
          p_Stack_1c8 = errorfd.fds_bits + 0xf;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            p_Stack_1c8[__arr._4_4_] = 0;
          }
          unique0x00004880 = &timeout.tv_usec;
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            unique0x00004880[__arr_1._4_4_] = 0;
          }
          iVar6 = (this->super_BaseSocketImpl).m_fSock;
          iVar2 = iVar6;
          if (iVar6 < 0) {
            iVar2 = iVar6 + 0x3f;
          }
          errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] =
               errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar6 & 0x3f);
          iVar6 = (this->super_BaseSocketImpl).m_fSock;
          iVar2 = iVar6;
          if (iVar6 < 0) {
            iVar2 = iVar6 + 0x3f;
          }
          errorfd.fds_bits[(long)(iVar2 >> 6) + -1] =
               errorfd.fds_bits[(long)(iVar2 >> 6) + -1] | 1L << ((ulong)(byte)iVar6 & 0x3f);
          iVar6 = select((this->super_BaseSocketImpl).m_fSock + 1,(fd_set *)(errorfd.fds_bits + 0xf)
                         ,(fd_set *)0x0,(fd_set *)&timeout.tv_usec,(timeval *)auStack_1b8);
        } while (iVar6 < 1);
        if ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + -1] &
            1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) != 0) {
          SenderAddr._20_4_ = 4;
          getsockopt((this->super_BaseSocketImpl).m_fSock,1,4,&(this->super_BaseSocketImpl).m_iError
                     ,(socklen_t *)(SenderAddr.sin6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
          (this->super_BaseSocketImpl).m_iErrLoc = 7;
          bVar3 = std::function::operator_cast_to_bool
                            ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
          if ((bVar3) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (&(this->super_BaseSocketImpl).m_fErrorParam,
                       (this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else {
            bVar3 = std::function::operator_cast_to_bool
                              ((function *)&(this->super_BaseSocketImpl).m_fError);
            if ((bVar3) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
              std::function<void_(BaseSocket_*)>::operator()
                        (&(this->super_BaseSocketImpl).m_fError,
                         (this->super_BaseSocketImpl).m_pBkRef);
            }
          }
          goto LAB_0013707f;
        }
      } while ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + 0xf] &
               1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) == 0);
      local_200[1] = 0x1c;
      iVar6 = (this->super_BaseSocketImpl).m_fSock;
      pcVar10 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[](&local_88,0);
      sVar11 = recvfrom(iVar6,pcVar10,0xffff,0,(sockaddr *)&transferred,(socklen_t *)(local_200 + 1)
                       );
      local_200[0] = (int)sVar11;
      if (local_200[0] < 1) break;
      std::__cxx11::stringstream::stringstream((stringstream *)(caAddrBuf.field_2._M_local_buf + 8))
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&iRet,0x2f,'\0',&local_3c1);
      std::allocator<char>::~allocator(&local_3c1);
      if ((ushort)transferred == 10) {
        poVar12 = std::operator<<(local_390,"[");
        uVar7 = (uint)(ushort)transferred;
        pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)&iRet);
        pcVar13 = inet_ntop(uVar7,&SenderAddr,pcVar13,0x20);
        std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(local_390,"]:");
        uVar5 = ntohs(transferred._2_2_);
        std::ostream::operator<<(poVar12,uVar5);
      }
      else {
        uVar7 = (uint)(ushort)transferred;
        pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)&iRet);
        pcVar13 = inet_ntop(uVar7,&sinLen,pcVar13,0x20);
        std::operator<<(local_390,pcVar13);
        poVar12 = std::operator<<(local_390,":");
        uVar5 = ntohs(transferred._2_2_);
        std::ostream::operator<<(poVar12,uVar5);
      }
      local_3c8 = 0;
      bVar4 = std::operator==(&this->m_fnSslDecode,(nullptr_t)0x0);
      tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ = 0;
      bVar3 = true;
      if (!bVar4) {
        __args = (uchar *)std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                                    (&local_88,0);
        __args_1 = (unsigned_long)local_200[0];
        std::__cxx11::stringstream::str();
        tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ = 1;
        local_3c8 = std::
                    function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    ::operator()(&this->m_fnSslDecode,__args,__args_1,&local_3e8);
        bVar3 = local_3c8 == 0;
      }
      if ((tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
           .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_3e8);
      }
      if (bVar3) {
        std::make_unique<unsigned_char[]>((size_t)&local_3f8);
        pcVar10 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[](&local_88,0);
        iVar6 = local_200[0];
        __result = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                   operator[](&local_3f8,0);
        std::copy_n<char*,int,unsigned_char*>(pcVar10,iVar6,__result);
        std::mutex::lock(&this->m_mxInDeque);
        std::__cxx11::stringstream::str();
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&,std::__cxx11::string>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                    *)&this->m_quInData,&local_3f8,local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock);
        std::__cxx11::string::~string((string *)&lock);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->m_atInBytes).super___atomic_base<unsigned_long>,(long)local_200[0]);
        std::mutex::unlock(&this->m_mxInDeque);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  (&local_3f8);
      }
      bVar3 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceived);
      if (((bVar3) ||
          (bVar3 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceivedParam),
          bVar3)) && ((((this->super_BaseSocketImpl).m_bStop & 1U) == 0 && (local_3c8 != -1)))) {
        std::lock_guard<std::mutex>::lock_guard(&local_420,(mutex_type *)local_78);
        if ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 0) {
          mxNotify.super___mutex_base._M_mutex.__size[0x27] = '\x01';
          local_440.mxNotify = (mutex *)local_78;
          local_440.bReadCall = (bool *)((long)&mxNotify.super___mutex_base._M_mutex + 0x27);
          local_440.this = this;
          std::thread::thread<UdpSocketImpl::SelectThread()::__0,,void>(&local_428,&local_440);
          std::thread::detach();
          std::thread::~thread(&local_428);
        }
        std::lock_guard<std::mutex>::~lock_guard(&local_420);
      }
      std::__cxx11::string::~string((string *)&iRet);
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)(caAddrBuf.field_2._M_local_buf + 8));
    }
    if (local_200[0] == 0) {
      iVar6 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
      if (iVar6 != 0) {
        piVar14 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar14;
        (this->super_BaseSocketImpl).m_iErrLoc = 9;
      }
      buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ = 1;
      while ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 1) {
        pUdpSocket._4_4_ = 10;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_208,(int *)((long)&pUdpSocket + 4))
        ;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_208);
      }
      pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
      if (pBVar1 == (BaseSocket *)0x0) {
        local_498 = (UdpSocket *)0x0;
      }
      else {
        local_498 = (UdpSocket *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0)
        ;
      }
      local_218 = local_498;
      bVar3 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceivedParam);
      if ((bVar3) && (local_218 != (UdpSocket *)0x0)) {
        std::function<void_(UdpSocket_*,_void_*)>::operator()
                  (&this->m_fBytesReceivedParam,local_218,(this->super_BaseSocketImpl).m_pvUserData)
        ;
      }
      else {
        bVar3 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceived);
        if ((bVar3) && (local_218 != (UdpSocket *)0x0)) {
          std::function<void_(UdpSocket_*)>::operator()(&this->m_fBytesReceived,local_218);
        }
      }
      goto LAB_0013707f;
    }
    piVar14 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar14;
  } while ((this->super_BaseSocketImpl).m_iError == 0xb);
  (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
  bVar3 = std::function::operator_cast_to_bool
                    ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
  if ((bVar3) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
    std::function<void_(BaseSocket_*,_void_*)>::operator()
              (&(this->super_BaseSocketImpl).m_fErrorParam,(this->super_BaseSocketImpl).m_pBkRef,
               (this->super_BaseSocketImpl).m_pvUserData);
  }
  else {
    bVar3 = std::function::operator_cast_to_bool((function *)&(this->super_BaseSocketImpl).m_fError)
    ;
    if ((bVar3) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
      std::function<void_(BaseSocket_*)>::operator()
                (&(this->super_BaseSocketImpl).m_fError,(this->super_BaseSocketImpl).m_pBkRef);
    }
  }
LAB_0013707f:
  if ((((buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ & 1) == 0) &&
      ((this->super_BaseSocketImpl).m_iError == 0)) &&
     (iVar6 = shutdown((this->super_BaseSocketImpl).m_fSock,0), iVar6 != 0)) {
    piVar14 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar14;
    (this->super_BaseSocketImpl).m_iErrLoc = 10;
  }
  while ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 1) {
    local_44c = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffbb8,&local_44c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffbb8);
  }
  std::mutex::lock((mutex *)local_78);
  std::mutex::unlock((mutex *)local_78);
  this_00 = &(this->super_BaseSocketImpl).m_iShutDownState;
  std::__atomic_base<unsigned_char>::operator|=(&this_00->super___atomic_base<unsigned_char>,'\x01')
  ;
  mVar8 = std::__cmpexch_failure_order(memory_order_seq_cst);
  switch(0x1372a7) {
  default:
    if (mVar8 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar8 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 2:
    if (mVar8 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar8 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 3:
    if (mVar8 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar8 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 4:
    if (mVar8 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar8 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
  }
  if (local_26) {
    if ((this->super_BaseSocketImpl).m_fSock != -1) {
      close((this->super_BaseSocketImpl).m_fSock);
    }
    (this->super_BaseSocketImpl).m_fSock = -1;
    bVar3 = std::function::operator_cast_to_bool
                      ((function *)&(this->super_BaseSocketImpl).m_fClosing);
    if ((bVar3) ||
       (bVar3 = std::function::operator_cast_to_bool
                          ((function *)&(this->super_BaseSocketImpl).m_fClosingParam), bVar3)) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])();
    }
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_88);
  return;
}

Assistant:

void UdpSocketImpl::SelectThread()
{
    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x40000)  // More than 256 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 7;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                union
                {
                    sockaddr_in sin;
                    sockaddr_in6 sin6;
                }SenderAddr;
                socklen_t sinLen = sizeof(SenderAddr);

                int32_t transferred = ::recvfrom(m_fSock, &buf[0], 0x0000ffff, 0, reinterpret_cast<sockaddr*>(&SenderAddr), &sinLen);

                if (transferred <= 0)
                {
                    if (transferred == 0)
                    {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                        // We set the flag, so we don't read on the connection any more
                        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                        {
                            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                            m_iErrLoc = 9;
                        }
                        bSocketShutDown = true;

                        while (bReadCall == true)
                            this_thread::sleep_for(chrono::milliseconds(10));

                        UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                        if (m_fBytesReceivedParam && pUdpSocket != nullptr)
                            m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                        else if (m_fBytesReceived && pUdpSocket != nullptr)
                            m_fBytesReceived(pUdpSocket);
                        break;
                    }
                    else
                    {
                        m_iError = WSAGetLastError();
                        if (m_iError != WSAEWOULDBLOCK)
                        {
                            m_iErrLoc = 11;
                            if (m_fErrorParam && m_bStop == false)
                                m_fErrorParam(m_pBkRef, m_pvUserData);
                            else if (m_fError && m_bStop == false)
                                m_fError(m_pBkRef);
                            break;
                        }
                    }
                }
                else
                {
                    stringstream strAbsender;
                    string caAddrBuf(INET6_ADDRSTRLEN + 1, 0);
                    if (SenderAddr.sin6.sin6_family == AF_INET6)
                    {
                        strAbsender << "[" << inet_ntop(SenderAddr.sin6.sin6_family, &SenderAddr.sin6.sin6_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << "]:" << ntohs(SenderAddr.sin6.sin6_port);
                    }
                    else
                    {
                        strAbsender << inet_ntop(SenderAddr.sin.sin_family, &SenderAddr.sin.sin_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << ":" << ntohs(SenderAddr.sin.sin_port);
                    }

                    int iRet = 0;
                    if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<uint8_t*>(&buf[0]), transferred, strAbsender.str()), iRet == 0))
                    {
                        auto tmp = make_unique<uint8_t[]>(transferred);
                        copy_n(&buf[0], transferred, &tmp[0]);
                        m_mxInDeque.lock();
                        m_quInData.emplace_back(move(tmp), transferred, strAbsender.str());
                        m_atInBytes += transferred;
                        m_mxInDeque.unlock();
                    }

                    if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                    {
                        lock_guard<mutex> lock(mxNotify);
                        if (bReadCall == false)
                        {
                            bReadCall = true;
                            thread([&]()
                            {
                                mxNotify.lock();
                                while (m_atInBytes > 0 && m_bStop == false)
                                {
                                    UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                                    mxNotify.unlock();
                                    if (m_fBytesReceivedParam != nullptr && pUdpSocket != nullptr)
                                        m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                                    else if (pUdpSocket != nullptr)
                                        m_fBytesReceived(pUdpSocket);
                                    mxNotify.lock();
                                }
                                bReadCall = false;
                                mxNotify.unlock();
                            }).detach();
                        }
                    }
                }
            }
        }
    }

    if (bSocketShutDown == false && m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 10;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // In rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}